

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qpauseanimation.cpp
# Opt level: O2

void QPauseAnimation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  int *piVar2;
  int iVar3;
  
  if (_c == WriteProperty) {
    if (_id == 0) {
      setDuration((QPauseAnimation *)_o,**_a);
      return;
    }
  }
  else if (_c == ReadProperty) {
    if (_id == 0) {
      piVar2 = (int *)*_a;
      iVar3 = (*_o->_vptr_QObject[0xc])();
      *piVar2 = iVar3;
      return;
    }
  }
  else if (_c == BindableProperty && _id == 0) {
    plVar1 = (long *)*_a;
    *plVar1 = (long)((_o->d_ptr).d + 2);
    plVar1[1] = (long)&QtPrivate::
                       QBindableInterfaceForProperty<QObjectCompatProperty<QPauseAnimationPrivate,_int,_&QPauseAnimationPrivate::_qt_property_duration_offset,_&QPauseAnimationPrivate::setDuration,_nullptr,_nullptr>,_void>
                       ::iface;
    return;
  }
  return;
}

Assistant:

void QPauseAnimation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPauseAnimation *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->duration(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDuration(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
    if (_c == QMetaObject::BindableProperty) {
        switch (_id) {
        case 0: *static_cast<QUntypedBindable *>(_a[0]) = _t->bindableDuration(); break;
        default: break;
        }
    }
}